

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<unsigned_long_long>>
               (GetterYs<unsigned_long_long> getter,TransformerLogLog transformer,
               ImDrawList *DrawList,ImPlotMarker marker,float size,bool rend_mk_line,
               ImU32 col_mk_line,float weight,bool rend_mk_fill,ImU32 col_mk_fill)

{
  unsigned_long_long uVar1;
  ImVec2 IVar2;
  undefined8 uVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  double dVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ImVec2 c;
  ImVec2 local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pIVar7 = GImPlot;
  if (0 < getter.Count) {
    iVar9 = 0;
    dVar12 = 0.0;
    do {
      pIVar8 = GImPlot;
      uVar1 = *(unsigned_long_long *)
               ((long)getter.Ys +
               (long)(((getter.Offset + iVar9) % getter.Count + getter.Count) % getter.Count) *
               (long)getter.Stride);
      auVar13._0_8_ = (double)CONCAT44(0x43300000,(int)uVar1);
      auVar13._8_4_ = (int)(uVar1 >> 0x20);
      auVar13._12_4_ = 0x45300000;
      dVar5 = log10((getter.XScale * dVar12 + getter.X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
      pIVar4 = pIVar8->CurrentPlot;
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = dVar5;
      local_68._12_4_ = extraout_XMM0_Dd;
      local_58 = pIVar8->LogDenX;
      uStack_50 = 0;
      dVar5 = (pIVar4->XAxis).Range.Min;
      local_48 = (pIVar4->XAxis).Range.Max;
      uStack_40 = 0;
      dVar6 = log10(((auVar13._8_8_ - 1.9342813113834067e+25) + (auVar13._0_8_ - 4503599627370496.0)
                    ) / pIVar4->YAxis[transformer.YAxis].Range.Min);
      pIVar4 = pIVar8->CurrentPlot;
      auVar14._8_8_ = dVar6;
      auVar14._0_8_ = local_68._0_8_;
      auVar15._8_4_ = SUB84(pIVar8->LogDenY[transformer.YAxis],0);
      auVar15._0_8_ = local_58;
      auVar15._12_4_ = (int)((ulong)pIVar8->LogDenY[transformer.YAxis] >> 0x20);
      auVar15 = divpd(auVar14,auVar15);
      dVar6 = pIVar4->YAxis[transformer.YAxis].Range.Min;
      IVar2 = pIVar8->PixelRange[transformer.YAxis].Min;
      fVar10 = (float)(pIVar8->Mx *
                       (((double)(float)auVar15._0_8_ * (local_48 - dVar5) + dVar5) -
                       (pIVar4->XAxis).Range.Min) + (double)IVar2.x);
      fVar11 = (float)(pIVar8->My[transformer.YAxis] *
                       (((double)(float)auVar15._8_8_ *
                         (pIVar4->YAxis[transformer.YAxis].Range.Max - dVar6) + dVar6) - dVar6) +
                      (double)IVar2.y);
      local_70.y = fVar11;
      local_70.x = fVar10;
      pIVar4 = pIVar7->CurrentPlot;
      if (((((pIVar4->PlotRect).Min.x <= fVar10) &&
           (uVar3 = *(undefined8 *)&(pIVar4->PlotRect).Min.y, (float)uVar3 <= fVar11)) &&
          (fVar10 < (float)((ulong)uVar3 >> 0x20))) && (fVar11 < (pIVar4->PlotRect).Max.y)) {
        (*RenderMarkers<ImPlot::TransformerLogLog,_ImPlot::GetterYs<unsigned_long_long>_>::
          marker_table[marker])
                  (DrawList,&local_70,size,rend_mk_line,col_mk_line,rend_mk_fill,col_mk_fill,weight)
        ;
      }
      dVar12 = dVar12 + 1.0;
      iVar9 = iVar9 + 1;
    } while (getter.Count != iVar9);
  }
  return;
}

Assistant:

inline void RenderMarkers(Getter getter, Transformer transformer, ImDrawList& DrawList, ImPlotMarker marker, float size, bool rend_mk_line, ImU32 col_mk_line, float weight, bool rend_mk_fill, ImU32 col_mk_fill) {
    static void (*marker_table[ImPlotMarker_COUNT])(ImDrawList&, const ImVec2&, float s, bool, ImU32, bool, ImU32, float) = {
        RenderMarkerCircle,
        RenderMarkerSquare,
        RenderMarkerDiamond ,
        RenderMarkerUp ,
        RenderMarkerDown ,
        RenderMarkerLeft,
        RenderMarkerRight,
        RenderMarkerCross,
        RenderMarkerPlus,
        RenderMarkerAsterisk
    };
    ImPlotContext& gp = *GImPlot;
    for (int i = 0; i < getter.Count; ++i) {
        ImVec2 c = transformer(getter(i));
        if (gp.CurrentPlot->PlotRect.Contains(c))
            marker_table[marker](DrawList, c, size, rend_mk_line, col_mk_line, rend_mk_fill, col_mk_fill, weight);
    }
}